

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

ImVec2 __thiscall
ImFont::CalcTextSizeA
          (ImFont *this,float size,float max_width,float wrap_width,char *text_begin,char *text_end,
          char **remaining)

{
  ImVec2 IVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  undefined8 *in_RCX;
  char *in_RDX;
  char *in_RSI;
  ImFont *in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float char_width;
  uint c;
  char *prev_s;
  char c_1;
  char *s;
  char *word_wrap_eol;
  bool word_wrap_enabled;
  float line_width;
  float scale;
  float line_height;
  ImVec2 text_size;
  float local_84;
  uint local_6c;
  char *local_68;
  char local_59;
  char *local_58;
  char *local_50;
  byte local_45;
  float local_44;
  float local_40;
  float local_3c;
  undefined8 *local_38;
  char *pcVar5;
  undefined4 in_stack_ffffffffffffffe0;
  float scale_00;
  ImFont *this_00;
  ImVec2 local_8;
  
  local_38 = in_RCX;
  local_58 = in_RSI;
  local_3c = in_XMM0_Da;
  this_00 = in_RDI;
  if (in_RDX == (char *)0x0) {
    pcVar5 = in_RSI;
    sVar4 = strlen(in_RSI);
    in_RDX = in_RSI + sVar4;
    local_58 = pcVar5;
    local_3c = in_XMM0_Da;
  }
  local_40 = local_3c / in_RDI->FontSize;
  scale_00 = local_3c;
  ImVec2::ImVec2(&local_8,0.0,0.0);
  local_44 = 0.0;
  local_45 = 0.0 < in_XMM2_Da;
  local_50 = (char *)0x0;
  pcVar5 = local_58;
LAB_001ae3d9:
  do {
    if (in_RDX <= local_58) {
LAB_001ae63e:
      if (local_8.x < local_44) {
        local_8.x = local_44;
      }
      if ((0.0 < local_44) || ((local_8.y == 0.0 && (!NAN(local_8.y))))) {
        local_8.y = local_3c + local_8.y;
      }
      if (local_38 != (undefined8 *)0x0) {
        *local_38 = local_58;
      }
      IVar1.y = local_8.y;
      IVar1.x = local_8.x;
      return IVar1;
    }
    if ((local_45 & 1) == 0) {
LAB_001ae4fc:
      local_68 = local_58;
      local_6c = (uint)*local_58;
      if (local_6c < 0x80) {
        local_58 = local_58 + 1;
      }
      else {
        iVar3 = ImTextCharFromUtf8(&local_6c,local_58,in_RDX);
        local_58 = local_58 + iVar3;
        if (local_6c == 0) goto LAB_001ae63e;
      }
      if (local_6c < 0x20) {
        if (local_6c == 10) {
          local_8.x = ImMax<float>(local_8.x,local_44);
          local_8.y = local_3c + local_8.y;
          local_44 = 0.0;
          goto LAB_001ae3d9;
        }
        if (local_6c == 0xd) goto LAB_001ae3d9;
      }
      if ((int)local_6c < (in_RDI->IndexAdvanceX).Size) {
        local_84 = (in_RDI->IndexAdvanceX).Data[local_6c];
      }
      else {
        local_84 = in_RDI->FallbackAdvanceX;
      }
      if (in_XMM1_Da <= local_44 + local_84 * local_40) {
        local_58 = local_68;
        goto LAB_001ae63e;
      }
      local_44 = local_84 * local_40 + local_44;
      goto LAB_001ae3d9;
    }
    if ((local_50 == (char *)0x0) &&
       (local_50 = CalcWordWrapPositionA
                             (this_00,scale_00,
                              (char *)CONCAT44(in_XMM2_Da,in_stack_ffffffffffffffe0),pcVar5,
                              (float)((ulong)in_RDX >> 0x20)), local_50 == local_58)) {
      local_50 = local_50 + 1;
    }
    if (local_58 < local_50) goto LAB_001ae4fc;
    if (local_8.x < local_44) {
      local_8.x = local_44;
    }
    local_8.y = local_3c + local_8.y;
    local_44 = 0.0;
    local_50 = (char *)0x0;
    for (; local_58 < in_RDX; local_58 = local_58 + 1) {
      local_59 = *local_58;
      bVar2 = ImCharIsBlankA(local_59);
      if (!bVar2) {
        if (local_59 == '\n') {
          local_58 = local_58 + 1;
        }
        break;
      }
    }
  } while( true );
}

Assistant:

ImVec2 ImFont::CalcTextSizeA(float size, float max_width, float wrap_width, const char* text_begin, const char* text_end, const char** remaining) const
{
    if (!text_end)
        text_end = text_begin + strlen(text_begin); // FIXME-OPT: Need to avoid this.

    const float line_height = size;
    const float scale = size / FontSize;

    ImVec2 text_size = ImVec2(0,0);
    float line_width = 0.0f;

    const bool word_wrap_enabled = (wrap_width > 0.0f);
    const char* word_wrap_eol = NULL;

    const char* s = text_begin;
    while (s < text_end)
    {
        if (word_wrap_enabled)
        {
            // Calculate how far we can render. Requires two passes on the string data but keeps the code simple and not intrusive for what's essentially an uncommon feature.
            if (!word_wrap_eol)
            {
                word_wrap_eol = CalcWordWrapPositionA(scale, s, text_end, wrap_width - line_width);
                if (word_wrap_eol == s) // Wrap_width is too small to fit anything. Force displaying 1 character to minimize the height discontinuity.
                    word_wrap_eol++;    // +1 may not be a character start point in UTF-8 but it's ok because we use s >= word_wrap_eol below
            }

            if (s >= word_wrap_eol)
            {
                if (text_size.x < line_width)
                    text_size.x = line_width;
                text_size.y += line_height;
                line_width = 0.0f;
                word_wrap_eol = NULL;

                // Wrapping skips upcoming blanks
                while (s < text_end)
                {
                    const char c = *s;
                    if (ImCharIsBlankA(c)) { s++; } else if (c == '\n') { s++; break; } else { break; }
                }
                continue;
            }
        }

        // Decode and advance source
        const char* prev_s = s;
        unsigned int c = (unsigned int)*s;
        if (c < 0x80)
        {
            s += 1;
        }
        else
        {
            s += ImTextCharFromUtf8(&c, s, text_end);
            if (c == 0) // Malformed UTF-8?
                break;
        }

        if (c < 32)
        {
            if (c == '\n')
            {
                text_size.x = ImMax(text_size.x, line_width);
                text_size.y += line_height;
                line_width = 0.0f;
                continue;
            }
            if (c == '\r')
                continue;
        }

        const float char_width = ((int)c < IndexAdvanceX.Size ? IndexAdvanceX.Data[c] : FallbackAdvanceX) * scale;
        if (line_width + char_width >= max_width)
        {
            s = prev_s;
            break;
        }

        line_width += char_width;
    }

    if (text_size.x < line_width)
        text_size.x = line_width;

    if (line_width > 0 || text_size.y == 0.0f)
        text_size.y += line_height;

    if (remaining)
        *remaining = s;

    return text_size;
}